

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

void __thiscall TCPConnection::Write(TCPConnection *this,uint8_t *data,uint16_t length)

{
  uint8_t uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  DataBuffer *pDVar4;
  ushort local_1c;
  ushort local_1a;
  uint16_t i;
  uint8_t *puStack_18;
  uint16_t length_local;
  uint8_t *data_local;
  TCPConnection *this_local;
  
  local_1a = length;
  puStack_18 = data;
  while( true ) {
    while( true ) {
      if (local_1a == 0) {
        return;
      }
      if (this->TxBuffer == (DataBuffer *)0x0) {
        pDVar4 = GetTxBuffer(this);
        this->TxBuffer = pDVar4;
        this->TxOffset = 0;
      }
      if (this->TxBuffer != (DataBuffer *)0x0) break;
      printf("Out of tx buffers\n");
    }
    if (local_1a < this->TxBuffer->Remainder) break;
    if (this->TxBuffer->Remainder <= local_1a) {
      for (local_1c = 0; local_1c < this->TxBuffer->Remainder; local_1c = local_1c + 1) {
        uVar1 = puStack_18[local_1c];
        puVar3 = this->TxBuffer->Packet;
        uVar2 = this->TxOffset;
        this->TxOffset = uVar2 + 1;
        puVar3[uVar2] = uVar1;
      }
      this->TxBuffer->Length = this->TxBuffer->Length + this->TxBuffer->Remainder;
      local_1a = local_1a - this->TxBuffer->Remainder;
      puStack_18 = puStack_18 + (int)(uint)this->TxBuffer->Remainder;
      this->TxBuffer->Remainder = 0;
      Flush(this);
    }
  }
  for (local_1c = 0; local_1c < local_1a; local_1c = local_1c + 1) {
    uVar1 = puStack_18[local_1c];
    puVar3 = this->TxBuffer->Packet;
    uVar2 = this->TxOffset;
    this->TxOffset = uVar2 + 1;
    puVar3[uVar2] = uVar1;
  }
  this->TxBuffer->Length = this->TxBuffer->Length + local_1a;
  this->TxBuffer->Remainder = this->TxBuffer->Remainder - local_1a;
  return;
}

Assistant:

void TCPConnection::Write(const uint8_t* data, uint16_t length)
{
    uint16_t i;

    while (length > 0)
    {
        if (!TxBuffer)
        {
            TxBuffer = GetTxBuffer();
            TxOffset = 0;
        }

        if (TxBuffer)
        {
            if (TxBuffer->Remainder > length)
            {
                for (i = 0; i < length; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += length;
                TxBuffer->Remainder -= length;
                break;
            }
            else if (TxBuffer->Remainder <= length)
            {
                for (i = 0; i < TxBuffer->Remainder; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += TxBuffer->Remainder;
                length -= TxBuffer->Remainder;
                data += TxBuffer->Remainder;
                TxBuffer->Remainder = 0;
                Flush();
            }
        }
        else
        {
            printf("Out of tx buffers\n");
        }
    }
}